

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

void __thiscall
chrono::ChArchiveExplorer::out_array_end(ChArchiveExplorer *this,ChValue *bVal,size_t msize)

{
  reference rVar1;
  
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->in_array,(long)this->tablevel)
  ;
  if ((*rVar1._M_p & rVar1._M_mask) != 0) {
    this->tablevel = this->tablevel + -1;
    std::_Bit_iterator_base::_M_bump_down
              (&(this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base);
    return;
  }
  return;
}

Assistant:

virtual void out_array_end (ChValue& bVal, size_t msize) {
            if (in_array[tablevel] == true) {
                --tablevel; 
                in_array.pop_back();
            }
      }